

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateLossLayer(Result *__return_storage_ptr__,LossLayer *lossLayer,
                          NeuralNetworkValidatorGraph *graph)

{
  bool bVar1;
  bool bVar2;
  LossLayerTypeCase LVar3;
  CategoricalCrossEntropyLossLayer *pCVar4;
  LayerNode *this;
  reference ppLVar5;
  const_reference __lhs;
  MeanSquaredErrorLossLayer *pMVar6;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  _Self local_2e0;
  _Self local_2d8;
  undefined1 local_2d0 [8];
  string targetName_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  _Self local_270;
  _Self local_268;
  undefined1 local_260 [8];
  string inputName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  _Self local_200;
  _Self local_1f8;
  undefined1 local_1f0 [8];
  string targetName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  LayerNode *local_150;
  LayerNode *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_> *__range2;
  vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_> *parents;
  undefined1 local_120 [3];
  bool lossInputValidated;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  LayerNode *local_c0;
  LayerNode *lossNode;
  string lossLayerName;
  undefined1 local_88 [8];
  string lossInputName;
  string err;
  Result r;
  NeuralNetworkValidatorGraph *graph_local;
  LossLayer *lossLayer_local;
  
  CoreML::Result::Result((Result *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)(lossInputName.field_2._M_local_buf + 8));
  LVar3 = CoreML::Specification::LossLayer::LossLayerType_case(lossLayer);
  if (LVar3 == kCategoricalCrossEntropyLossLayer) {
    pCVar4 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
    psVar7 = CoreML::Specification::CategoricalCrossEntropyLossLayer::input_abi_cxx11_(pCVar4);
    std::__cxx11::string::string((string *)local_88,(string *)psVar7);
    psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
    std::__cxx11::string::string((string *)&lossNode,(string *)psVar7);
    std::__cxx11::string::string((string *)&local_e0,(string *)&lossNode);
    this = CoreML::NeuralNetworkValidatorGraph::getNodeFromName(graph,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    local_c0 = this;
    if (this == (LayerNode *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "Failed to look up node for \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lossNode)
      ;
      std::operator+(&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     "\'.");
      std::__cxx11::string::operator=
                ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)local_120);
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                 (string *)(lossInputName.field_2._M_local_buf + 8));
      parents._4_4_ = 1;
    }
    else {
      bVar2 = false;
      __end2 = std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::begin
                         (&this->parents);
      node = (LayerNode *)
             std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>::end
                       (&this->parents);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
                                         *)&node), bVar1) {
        ppLVar5 = __gnu_cxx::
                  __normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
                  ::operator*(&__end2);
        local_150 = *ppLVar5;
        if (local_150->layerType == kSoftmax) {
          __lhs = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_150->outputNames,0);
          bVar2 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_88);
          if (bVar2) {
            psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
            std::operator+(&local_190,"For the categorical cross entropy loss layer named \'",psVar7
                          );
            std::operator+(&local_170,&local_190,"\', input is not generated from a softmax output."
                          );
            std::__cxx11::string::operator=
                      ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            CoreML::Result::Result
                      (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                       (string *)(lossInputName.field_2._M_local_buf + 8));
            parents._4_4_ = 1;
            goto LAB_009af07b;
          }
          bVar2 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<CoreML::LayerNode_*const_*,_std::vector<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>_>
        ::operator++(&__end2);
      }
      if (bVar2) {
        pCVar4 = CoreML::Specification::LossLayer::categoricalcrossentropylosslayer(lossLayer);
        psVar7 = CoreML::Specification::CategoricalCrossEntropyLossLayer::target_abi_cxx11_(pCVar4);
        std::__cxx11::string::string((string *)local_1f0,(string *)psVar7);
        local_1f8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
             ::find(&graph->blobNameToProducingNode,(key_type *)local_1f0);
        local_200._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
             ::end(&graph->blobNameToProducingNode);
        bVar2 = std::operator!=(&local_1f8,&local_200);
        if (bVar2) {
          psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&inputName.field_2 + 8),"For the cross entropy loss layer named \'",
                         psVar7);
          std::operator+(&local_220,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&inputName.field_2 + 8),"\', target is generated within the graph.")
          ;
          std::__cxx11::string::operator=
                    ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)(inputName.field_2._M_local_buf + 8));
          CoreML::Result::Result
                    (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                     (string *)(lossInputName.field_2._M_local_buf + 8));
          parents._4_4_ = 1;
        }
        else {
          parents._4_4_ = 2;
        }
        std::__cxx11::string::~string((string *)local_1f0);
      }
      else {
        psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&targetName.field_2 + 8),
                       "For the categorical cross entropy loss layer named \'",psVar7);
        std::operator+(&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&targetName.field_2 + 8),
                       "\', input is not generated from a softmax output.");
        std::__cxx11::string::operator=
                  ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)(targetName.field_2._M_local_buf + 8));
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                   (string *)(lossInputName.field_2._M_local_buf + 8));
        parents._4_4_ = 1;
      }
    }
LAB_009af07b:
    std::__cxx11::string::~string((string *)&lossNode);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    if (LVar3 != kMeanSquaredErrorLossLayer) {
      psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
      std::operator+(&local_360,"Loss function is not recognized in the loss layer named \'",psVar7)
      ;
      std::operator+(&local_340,&local_360,"\', only cross entropy loss and MSE are supported.");
      std::__cxx11::string::operator=
                ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      std::__cxx11::string::~string((string *)&local_360);
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                 (string *)(lossInputName.field_2._M_local_buf + 8));
      goto LAB_009af49f;
    }
    pMVar6 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
    psVar7 = CoreML::Specification::MeanSquaredErrorLossLayer::input_abi_cxx11_(pMVar6);
    std::__cxx11::string::string((string *)local_260,(string *)psVar7);
    local_268._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
         ::find(&graph->blobNameToProducingNode,(key_type *)local_260);
    local_270._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
         ::end(&graph->blobNameToProducingNode);
    bVar2 = std::operator==(&local_268,&local_270);
    if (bVar2) {
      psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetName_1.field_2 + 8),"For the MSE loss layer named \'",psVar7);
      std::operator+(&local_290,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetName_1.field_2 + 8),
                     "\', input is not generated within the graph.");
      std::__cxx11::string::operator=
                ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)(targetName_1.field_2._M_local_buf + 8));
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                 (string *)(lossInputName.field_2._M_local_buf + 8));
      parents._4_4_ = 1;
    }
    else {
      pMVar6 = CoreML::Specification::LossLayer::meansquarederrorlosslayer(lossLayer);
      psVar7 = CoreML::Specification::MeanSquaredErrorLossLayer::target_abi_cxx11_(pMVar6);
      std::__cxx11::string::string((string *)local_2d0,(string *)psVar7);
      local_2d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
           ::find(&graph->blobNameToProducingNode,(key_type *)local_2d0);
      local_2e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
           ::end(&graph->blobNameToProducingNode);
      bVar2 = std::operator!=(&local_2d8,&local_2e0);
      if (bVar2) {
        psVar7 = CoreML::Specification::LossLayer::name_abi_cxx11_(lossLayer);
        std::operator+(&local_320,"For the MSE loss layer named \'",psVar7);
        std::operator+(&local_300,&local_320,"\', target is generated within the graph.");
        std::__cxx11::string::operator=
                  ((string *)(lossInputName.field_2._M_local_buf + 8),(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        CoreML::Result::Result
                  (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                   (string *)(lossInputName.field_2._M_local_buf + 8));
        parents._4_4_ = 1;
      }
      else {
        parents._4_4_ = 2;
      }
      std::__cxx11::string::~string((string *)local_2d0);
    }
    std::__cxx11::string::~string((string *)local_260);
  }
  if (parents._4_4_ == 2) {
    CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
  }
LAB_009af49f:
  std::__cxx11::string::~string((string *)(lossInputName.field_2._M_local_buf + 8));
  CoreML::Result::~Result((Result *)((long)&err.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

static Result validateLossLayer(const Specification::LossLayer *lossLayer, const NeuralNetworkValidatorGraph *graph) {
    Result r;
    std::string err;
    
    switch (lossLayer->LossLayerType_case()) {
        case CoreML::Specification::LossLayer::kCategoricalCrossEntropyLossLayer:
        {
            std::string lossInputName = lossLayer->categoricalcrossentropylosslayer().input();

            // validate loss input.
            std::string lossLayerName = lossLayer->name();
            const auto *lossNode = graph->getNodeFromName(lossLayerName);
            if (lossNode == NULL) {
                err = "Failed to look up node for '" + lossLayerName + "'.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            bool lossInputValidated = false;
            const auto &parents = lossNode->parents;
            for (const auto *node : parents) {
                if (node->layerType == Specification::NeuralNetworkLayer::kSoftmax) {
                    if (node->outputNames[0] != lossInputName) {
                        err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                    }
                    lossInputValidated = true;
                    break;
                }
            }

            if (!lossInputValidated) {
                err = "For the categorical cross entropy loss layer named '" + lossLayer->name() + "', input is not generated from a softmax output.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }

            // validate loss target
            std::string targetName = lossLayer->categoricalcrossentropylosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the cross entropy loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        case CoreML::Specification::LossLayer::kMeanSquaredErrorLossLayer:
        {
            std::string inputName = lossLayer->meansquarederrorlosslayer().input();
            if (graph->blobNameToProducingNode.find(inputName) == graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', input is not generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            std::string targetName = lossLayer->meansquarederrorlosslayer().target();
            if (graph->blobNameToProducingNode.find(targetName) != graph->blobNameToProducingNode.end()) {
                err = "For the MSE loss layer named '" + lossLayer->name() + "', target is generated within the graph.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            break;
        }
        default:
            err = "Loss function is not recognized in the loss layer named '" + lossLayer->name() + "', only cross entropy loss and MSE are supported.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}